

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PopFunctionScope(cmMakefile *this,bool reportError)

{
  PopPolicy(this);
  PopSnapshot(this,reportError);
  PopFunctionBlockerBarrier(this,reportError);
  cmFileLockPool::PopFunctionScope(&this->GlobalGenerator->FileLockPool);
  PopLoopBlockBarrier(this);
  CheckForUnusedVariables(this);
  return;
}

Assistant:

void cmMakefile::PopFunctionScope(bool reportError)
{
  this->PopPolicy();

  this->PopSnapshot(reportError);

  this->PopFunctionBlockerBarrier(reportError);

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PopFunctionScope();
#endif

  this->PopLoopBlockBarrier();

  this->CheckForUnusedVariables();
}